

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_uint8(coda_cursor *cursor,uint8_t *dst)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  coda_native_type read_type;
  coda_native_type local_1c;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n - 1].type == (coda_dynamic_type_struct *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar3 = 0x71c;
  }
  else {
    if (dst != (uint8_t *)0x0) {
      get_read_type(cursor,&local_1c);
      if (local_1c != coda_native_type_uint8) {
        pcVar2 = coda_type_get_native_type_name(local_1c);
        coda_set_error(-0x69,"can not read %s data using a uint8 data type",pcVar2);
        return -1;
      }
      iVar1 = read_uint8(cursor,dst);
      return -(uint)(iVar1 != 0);
    }
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar3 = 0x721;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar3);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_uint8(const coda_cursor *cursor, uint8_t *dst)
{
    coda_native_type read_type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_read_type(cursor, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_uint8:
            if (read_uint8(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a uint8 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}